

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O1

RPCHelpMan * savemempool(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong *puVar2;
  string m_key_name;
  string m_key_name_00;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  undefined8 uVar4;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  undefined8 in_stack_fffffffffffffc48;
  undefined8 in_stack_fffffffffffffc58;
  undefined8 in_stack_fffffffffffffc60;
  undefined8 in_stack_fffffffffffffc68;
  code *pcVar5;
  undefined8 in_stack_fffffffffffffc70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffc78;
  pointer pRVar6;
  pointer pRVar7;
  pointer pRVar8;
  _Vector_impl_data in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffcb8 [24];
  pointer in_stack_fffffffffffffcd0;
  vector<RPCArg,_std::allocator<RPCArg>_> local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  ulong *local_248;
  undefined8 local_240;
  ulong local_238;
  undefined8 uStack_230;
  ulong *local_228;
  size_type local_220;
  ulong local_218;
  undefined8 uStack_210;
  long *local_208 [2];
  long local_1f8 [2];
  long *local_1e8 [2];
  long local_1d8 [2];
  RPCResult local_1c8;
  long *local_140 [2];
  long local_130 [2];
  long *local_120 [2];
  long local_110 [2];
  RPCResult local_100;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"savemempool","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "\nDumps the mempool to disk. It will fail until the previous dump is fully loaded.\n",
             "");
  local_120[0] = local_110;
  local_328.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_328.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_328.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"");
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"");
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"filename","");
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_208,"the directory and file where the mempool was saved","");
  pRVar6 = (pointer)0x0;
  pRVar7 = (pointer)0x0;
  pRVar8 = (pointer)0x0;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc48;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffc58;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffffc60;
  description._M_string_length = in_stack_fffffffffffffc70;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc68;
  description.field_2 = in_stack_fffffffffffffc78;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_1c8,STR,m_key_name,description,inner,SUB81(local_1e8,0));
  __l._M_len = 1;
  __l._M_array = &local_1c8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffca8,__l,
             (allocator_type *)&stack0xfffffffffffffc87);
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc48;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffffc58;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffffc60;
  description_00._M_string_length = in_stack_fffffffffffffc70;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc68;
  description_00.field_2 = in_stack_fffffffffffffc78;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar7;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar6;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar8;
  RPCResult::RPCResult(&local_100,OBJ,m_key_name_00,description_00,inner_00,SUB81(local_120,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result._0_8_ = in_stack_fffffffffffffc48;
  result.m_key_name._M_string_length = in_stack_fffffffffffffc58;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffc60;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffffc68;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffc70;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffffc78;
  result._64_8_ = pRVar6;
  result.m_description._M_dataplus._M_p = (pointer)pRVar7;
  result.m_description._M_string_length = (size_type)pRVar8;
  result._88_24_ = in_stack_fffffffffffffca0;
  result.m_cond._M_string_length = in_stack_fffffffffffffcb8._0_8_;
  result.m_cond.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffcb8._8_16_;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffffcc0,result);
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"savemempool","");
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
  HelpExampleCli(&local_268,&local_288,&local_2a8);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"savemempool","");
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"");
  HelpExampleRpc(&local_2c8,&local_2e8,&local_308);
  uVar4 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    uVar4 = local_268.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar4 < local_2c8._M_string_length + local_268._M_string_length) {
    uVar4 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      uVar4 = local_2c8.field_2._M_allocated_capacity;
    }
    if (local_2c8._M_string_length + local_268._M_string_length <= (ulong)uVar4) {
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_2c8,0,0,local_268._M_dataplus._M_p,local_268._M_string_length);
      goto LAB_003087ab;
    }
  }
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_268,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
LAB_003087ab:
  local_248 = &local_238;
  puVar2 = (ulong *)(pbVar3->_M_dataplus)._M_p;
  paVar1 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar1) {
    local_238 = paVar1->_M_allocated_capacity;
    uStack_230 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_238 = paVar1->_M_allocated_capacity;
    local_248 = puVar2;
  }
  local_220 = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar3->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_248 == &local_238) {
    uStack_210 = uStack_230;
    local_228 = &local_218;
  }
  else {
    local_228 = local_248;
  }
  local_218 = local_238;
  local_240 = 0;
  local_238 = local_238 & 0xffffffffffffff00;
  pcVar5 = std::
           _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mempool.cpp:792:9)>
           ::_M_manager;
  description_01._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mempool.cpp:792:9)>
       ::_M_invoke;
  description_01._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mempool.cpp:792:9)>
                ::_M_manager;
  description_01.field_2 = in_stack_fffffffffffffc78;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar7;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar6;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar8;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffffcd0;
  examples.m_examples._0_24_ = in_stack_fffffffffffffcb8;
  local_248 = &local_238;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffffc58)),description_01,args,
             (RPCResults)in_stack_fffffffffffffca0,examples,(RPCMethodImpl *)&local_58);
  if (pcVar5 != (code *)0x0) {
    (*pcVar5)(&stack0xfffffffffffffc58,&stack0xfffffffffffffc58,3);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228,local_218 + 1);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,local_238 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffcc0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_cond._M_dataplus._M_p != &local_100.m_cond.field_2) {
    operator_delete(local_100.m_cond._M_dataplus._M_p,
                    local_100.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_description._M_dataplus._M_p != &local_100.m_description.field_2) {
    operator_delete(local_100.m_description._M_dataplus._M_p,
                    local_100.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_100.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_key_name._M_dataplus._M_p != &local_100.m_key_name.field_2) {
    operator_delete(local_100.m_key_name._M_dataplus._M_p,
                    local_100.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffca8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.m_cond._M_dataplus._M_p != &local_1c8.m_cond.field_2) {
    operator_delete(local_1c8.m_cond._M_dataplus._M_p,
                    local_1c8.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.m_description._M_dataplus._M_p != &local_1c8.m_description.field_2) {
    operator_delete(local_1c8.m_description._M_dataplus._M_p,
                    local_1c8.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1c8.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.m_key_name._M_dataplus._M_p != &local_1c8.m_key_name.field_2) {
    operator_delete(local_1c8.m_key_name._M_dataplus._M_p,
                    local_1c8.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffc88);
  if (local_208[0] != local_1f8) {
    operator_delete(local_208[0],local_1f8[0] + 1);
  }
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0],local_130[0] + 1);
  }
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],local_110[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_328);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan savemempool()
{
    return RPCHelpMan{"savemempool",
        "\nDumps the mempool to disk. It will fail until the previous dump is fully loaded.\n",
        {},
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::STR, "filename", "the directory and file where the mempool was saved"},
            }},
        RPCExamples{
            HelpExampleCli("savemempool", "")
            + HelpExampleRpc("savemempool", "")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const ArgsManager& args{EnsureAnyArgsman(request.context)};
    const CTxMemPool& mempool = EnsureAnyMemPool(request.context);

    if (!mempool.GetLoadTried()) {
        throw JSONRPCError(RPC_MISC_ERROR, "The mempool was not loaded yet");
    }

    const fs::path& dump_path = MempoolPath(args);

    if (!DumpMempool(mempool, dump_path)) {
        throw JSONRPCError(RPC_MISC_ERROR, "Unable to dump mempool to disk");
    }

    UniValue ret(UniValue::VOBJ);
    ret.pushKV("filename", dump_path.utf8string());

    return ret;
},
    };
}